

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void readTag(FILE *fp,int *type,int *val)

{
  uint uVar1;
  uint uVar2;
  uint local_30;
  uint32_t tmp;
  int inByte;
  int tempSize;
  int i;
  int *val_local;
  int *type_local;
  FILE *fp_local;
  
  uVar1 = get_byte(fp);
  if (uVar1 == 0xffffffff) {
    error_impl("readTag",0x2c0,"Unexpected EOF reading image file: reading tag byte.");
  }
  *type = uVar1 & 0xe0;
  if ((uVar1 & 0x10) == 0) {
    *val = uVar1 & 0x1f;
  }
  else {
    local_30 = 0;
    *val = 0;
    uVar1 = uVar1 & 0xf;
    if (8 < uVar1) {
      error_impl("readTag",0x2d2,
                 "readTag(): Error reading image file: tag value field exceeds machine word size.  Image created on another machine? Field size=%d"
                 ,(ulong)uVar1);
    }
    for (inByte = 0; inByte < (int)uVar1; inByte = inByte + 1) {
      uVar2 = get_byte(fp);
      if (uVar2 == 0xffffffff) {
        error_impl("readTag",0x2d9,"readTag(): Unexpected EOF reading image file!");
      }
      local_30 = local_30 | (uVar2 & 0xff) << ((byte)(inByte << 3) & 0x1f);
    }
    *val = local_30;
  }
  return;
}

Assistant:

static void readTag(FILE *fp, int *type, int *val)
{
    int i;
    int tempSize;
    int inByte;

    inByte = get_byte(fp);
    if (inByte == EOF) {
        error("Unexpected EOF reading image file: reading tag byte.");
    }

    tempSize = (int)(inByte & LST_TAG_SIZE_MASK);
    *type = (int)(inByte & LST_TAG_TYPE_MASK);

    if(tempSize & LST_LARGE_TAG_FLAG) {
        uint32_t tmp = 0;

        /* large size, actual value is in succeeding
        bytes (tempSize bytes). The value is not sign
        extended. */
        *val = 0;

        /* get the number of bytes in the size field */
        tempSize = tempSize & LST_SMALL_TAG_LIMIT;

        if(tempSize>BytesPerWord) {
            error("readTag(): Error reading image file: tag value field exceeds machine word size.  Image created on another machine? Field size=%d", tempSize);
        }

        for(i=0; i<tempSize; i++) {
            inByte = get_byte(fp);

            if(inByte == EOF) {
                error("readTag(): Unexpected EOF reading image file!");
            }

            tmp = tmp  | (((uint32_t)inByte & (uint32_t)0xFF) << ((uint32_t)8*(uint32_t)i));
        }

        *val = (int)(unsigned int)tmp;
    } else {
        *val = tempSize;
    }
}